

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load(elfio *this,string *file_name)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long local_228;
  ifstream stream;
  string *file_name_local;
  elfio *this_local;
  
  std::ifstream::ifstream(&local_228);
  _Var2 = std::__cxx11::string::c_str();
  std::operator|(_S_in,_S_bin);
  std::ifstream::open((char *)&local_228,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->name,(string *)file_name);
    this_local._7_1_ = load(this,(istream *)&local_228);
  }
  else {
    this_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return this_local._7_1_;
}

Assistant:

bool load( const std::string& file_name )
    {
        std::ifstream stream;
        stream.open( file_name.c_str(), std::ios::in | std::ios::binary );
        if ( !stream ) {
            return false;
        }

		this->name = file_name;
        return load(stream);
    }